

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InnerObjectFormats.cpp
# Opt level: O2

void __thiscall jbcoin::InnerObjectFormats::InnerObjectFormats(InnerObjectFormats *this)

{
  Item *pIVar1;
  SOElement local_48;
  SOElement local_38;
  SOElement local_28;
  
  KnownFormats<int>::KnownFormats(&this->super_KnownFormats<int>);
  (this->super_KnownFormats<int>)._vptr_KnownFormats = (_func_int **)&PTR_addCommonFields_002f82b0;
  pIVar1 = KnownFormats<int>::add(&this->super_KnownFormats<int>,_DAT_00304698,sfSignerEntry);
  local_38.e_field = (SField *)sfAccount;
  local_38.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar1->elements,&local_38);
  local_48.e_field = (SField *)sfSignerWeight;
  local_48.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar1->elements,&local_48);
  pIVar1 = KnownFormats<int>::add(&this->super_KnownFormats<int>,_DAT_003046f8,sfSigner);
  local_38.e_field = (SField *)sfAccount;
  local_38.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar1->elements,&local_38);
  local_48.e_field = (SField *)sfSigningPubKey;
  local_48.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar1->elements,&local_48);
  local_28.e_field = (SField *)sfTxnSignature;
  local_28.flags = SOE_REQUIRED;
  SOTemplate::push_back(&pIVar1->elements,&local_28);
  return;
}

Assistant:

InnerObjectFormats::InnerObjectFormats ()
{
    add (sfSignerEntry.getJsonName ().c_str (), sfSignerEntry.getCode ())
        << SOElement (sfAccount,              SOE_REQUIRED)
        << SOElement (sfSignerWeight,         SOE_REQUIRED)
        ;

    add (sfSigner.getJsonName ().c_str (), sfSigner.getCode ())
        << SOElement (sfAccount,              SOE_REQUIRED)
        << SOElement (sfSigningPubKey,        SOE_REQUIRED)
        << SOElement (sfTxnSignature,         SOE_REQUIRED)
        ;
}